

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O0

void __thiscall
serialize_tests::Derived::Serialize<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>>
          (Derived *this,ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> *s)

{
  Derived *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> *s_00;
  
  s_00 = *(ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> **)
          (in_FS_OFFSET + 0x28);
  Ser<ParamsStream<DataStream&,serialize_tests::DerivedAndBaseFormat>>(s_00,in_RDI);
  if (*(ParamsStream<DataStream_&,_serialize_tests::DerivedAndBaseFormat> **)(in_FS_OFFSET + 0x28)
      == s_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(Derived, obj)
    {
        auto& fmt = SER_PARAMS(DerivedAndBaseFormat);
        READWRITE(fmt.m_base_format(AsBase<Base>(obj)));

        if (ser_action.ForRead()) {
            std::string str;
            s >> str;
            SER_READ(obj, obj.m_derived_data = str);
        } else {
            s << (fmt.m_derived_format == DerivedAndBaseFormat::DerivedFormat::LOWER ?
                      ToLower(obj.m_derived_data) :
                      ToUpper(obj.m_derived_data));
        }
    }